

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerOpenWal(Pager *pPager)

{
  Wal **in_RDI;
  i64 unaff_retaddr;
  int rc;
  sqlite3_file *in_stack_00000018;
  sqlite3_vfs *in_stack_00000020;
  uint in_stack_fffffffffffffff0;
  int iVar1;
  
  iVar1 = 0;
  if (*(char *)(in_RDI + 1) != '\0') {
    iVar1 = pagerExclusiveLock((Pager *)(ulong)in_stack_fffffffffffffff0);
  }
  if (iVar1 == 0) {
    iVar1 = sqlite3WalOpen(in_stack_00000020,in_stack_00000018,(char *)pPager,rc,unaff_retaddr,
                           in_RDI);
  }
  pagerFixMaplimit((Pager *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  return iVar1;
}

Assistant:

static int pagerOpenWal(Pager *pPager){
  int rc = SQLITE_OK;

  assert( pPager->pWal==0 && pPager->tempFile==0 );
  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );

  /* If the pager is already in exclusive-mode, the WAL module will use
  ** heap-memory for the wal-index instead of the VFS shared-memory
  ** implementation. Take the exclusive lock now, before opening the WAL
  ** file, to make sure this is safe.
  */
  if( pPager->exclusiveMode ){
    rc = pagerExclusiveLock(pPager);
  }

  /* Open the connection to the log file. If this operation fails,
  ** (e.g. due to malloc() failure), return an error code.
  */
  if( rc==SQLITE_OK ){
    rc = sqlite3WalOpen(pPager->pVfs,
        pPager->fd, pPager->zWal, pPager->exclusiveMode,
        pPager->journalSizeLimit, &pPager->pWal
    );
  }
  pagerFixMaplimit(pPager);

  return rc;
}